

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlTablePass.cpp
# Opt level: O2

void __thiscall GdlPass::ClearFsmWorkSpace(GdlPass *this)

{
  _Base_ptr this_00;
  pointer ppFVar1;
  pointer ppFVar2;
  FsmMachineClass *this_01;
  _Base_ptr p_Var3;
  size_t i;
  ulong uVar4;
  
  for (p_Var3 = (this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_hmMachineClassMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    this_00 = p_Var3[1]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      std::_Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>::~_Vector_base
                ((_Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_> *)this_00);
    }
    operator_delete(this_00,0x18);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>,_std::_Select1st<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>_*>_>_>
  ::clear(&(this->m_hmMachineClassMap)._M_t);
  uVar4 = 0;
  while( true ) {
    ppFVar1 = (this->m_vpfsmc).
              super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppFVar2 = (this->m_vpfsmc).
              super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppFVar2 - (long)ppFVar1 >> 3) <= uVar4) break;
    this_01 = ppFVar1[uVar4];
    if (this_01 != (FsmMachineClass *)0x0) {
      FsmMachineClass::~FsmMachineClass(this_01);
    }
    operator_delete(this_01,0x78);
    uVar4 = uVar4 + 1;
  }
  if (ppFVar2 != ppFVar1) {
    (this->m_vpfsmc).super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppFVar1;
  }
  return;
}

Assistant:

void GdlPass::ClearFsmWorkSpace()
{
	//	Delete all the machine-class lists in the hash map.
	for (std::map<int, MachineClassList>::iterator hmit = m_hmMachineClassMap.begin();
		hmit != m_hmMachineClassMap.end();
		++hmit)
	{
		delete hmit->second;	// vector containing a group of machine classes with the same key;
								// notice that we store a pointer to the vector which is separately
								// allocated, not the vector itself, due to the limitations of the
								// previous HashMap implementation.
	}
	m_hmMachineClassMap.clear();

	//	Delete all the FsmMachineClasses and clear the master list.
	for (size_t i = 0; i < m_vpfsmc.size(); i++)
		delete m_vpfsmc[i];
	m_vpfsmc.clear();
}